

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O3

TypeAliasType * slang::ast::TypeAliasType::fromSyntax(Scope *scope,TypedefDeclarationSyntax *syntax)

{
  undefined1 *puVar1;
  Compilation *this;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  TypeAliasType *this_00;
  SourceLocation local_40;
  string_view local_38;
  
  this = scope->compilation;
  local_38 = parsing::Token::valueText(&syntax->name);
  local_40 = parsing::Token::location(&syntax->name);
  this_00 = BumpAllocator::
            emplace<slang::ast::TypeAliasType,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                      (&this->super_BumpAllocator,&local_38,&local_40);
  (this_00->targetType).typeOrLink = (anon_union_8_2_f12d5f64_for_typeOrLink)(syntax->type).ptr;
  puVar1 = &(this_00->targetType).field_0x3f;
  *puVar1 = *puVar1 & 0x7f;
  DeclaredType::setDimensionSyntax(&this_00->targetType,&syntax->dimensions);
  (this_00->super_Type).super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes((Symbol *)this_00,scope,syntax_00);
  return this_00;
}

Assistant:

TypeAliasType& TypeAliasType::fromSyntax(const Scope& scope,
                                         const TypedefDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<TypeAliasType>(syntax.name.valueText(), syntax.name.location());
    result->targetType.setTypeSyntax(*syntax.type);
    result->targetType.setDimensionSyntax(syntax.dimensions);
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    return *result;
}